

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O3

error<idx2::idx2_err_code>
idx2::TraverseFirstLevel
          (idx2_file *Idx2,params *P,decode_data *D,grid *OutGrid,mmap_volume *OutVolFile,
          volume *OutVolMem)

{
  mutex *__mutex;
  atomic<unsigned_long> *paVar1;
  int iVar2;
  i32 iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  i64 iVar7;
  decode_data *pdVar8;
  undefined4 uVar9;
  long lVar10;
  file_traverse *pfVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  char Level;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  u64 uVar18;
  chunk_traverse *pcVar19;
  uint uVar20;
  uint uVar21;
  v3<int> *pvVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  ulong *puVar33;
  long lVar34;
  long *in_FS_OFFSET;
  extent eVar35;
  v3i Brick3;
  ulong local_2dd8;
  ulong local_2db8;
  brick_traverse First_2;
  decode_data *D_local;
  long local_2d60;
  uint local_2d58;
  int local_2d54;
  ulong local_2d50;
  extent Skip;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  i64 iStack_2d20;
  undefined8 uStack_2d18;
  u64 local_2d10;
  extent local_2d08;
  extent local_2cf8;
  ulong local_2ce8;
  extent *local_2ce0;
  params *local_2cd8;
  grid *local_2cd0;
  extent Skip_1;
  volume *OutVolMem_local;
  mmap_volume *OutVolFile_local;
  extent local_2ca8;
  extent local_2c98;
  extent local_2c88;
  undefined4 local_2c74;
  undefined4 uStack_2c70;
  undefined4 uStack_2c6c;
  int iStack_2c68;
  undefined7 uStack_2c63;
  undefined4 local_2c5c;
  undefined4 uStack_2c58;
  undefined4 uStack_2c54;
  undefined4 uStack_2c50;
  undefined4 local_2c4c;
  extent local_2c48;
  chunk_traverse First_1;
  undefined8 uStack_1c48;
  undefined4 auStack_1c40 [2];
  file_traverse First;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_1c08;
  u64 local_1c00 [505];
  file_traverse FileStack [64];
  
  uVar18 = 0x100000000;
  Level = Idx2->NLevels + -1;
  local_2cf8.From = 0;
  local_2cf8.Dims = 0;
  local_2d08.From = 0;
  local_2d08.Dims = 0;
  local_2ca8.From = 0;
  local_2ca8.Dims = 0;
  local_2c88.From = 0;
  local_2c88.Dims = 0;
  local_2c98.From = 0;
  local_2c98.Dims = 0;
  local_2ce0 = &P->DecodeExtent;
  local_2c48.From = 0;
  local_2c48.Dims = 0;
  uVar20 = (uint)Level;
  D_local = D;
  local_2cd8 = P;
  local_2cd0 = OutGrid;
  OutVolMem_local = OutVolMem;
  OutVolFile_local = OutVolFile;
  ComputeExtentsForTraversal
            (Idx2,local_2ce0,Level,&local_2cf8,&local_2d08,&local_2ca8,&local_2c88,&local_2c98,
             &local_2c48);
  if (Level < '\x01') {
    iVar23 = 1;
    iVar26 = 1;
    iVar30 = 1;
  }
  else {
    iVar23 = 1;
    iVar26 = 1;
    iVar30 = 1;
    uVar21 = uVar20;
    do {
      iVar30 = iVar30 * (Idx2->GroupBrick3).field_0.field_0.Z;
      iVar23 = (Idx2->GroupBrick3).field_0.field_0.X * iVar23;
      iVar26 = iVar26 * (Idx2->GroupBrick3).field_0.field_0.Y;
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
  }
  uVar21 = (Idx2->BrickDims3).field_0.field_0.X * iVar23;
  uVar14 = (ulong)(uint)(iVar26 * (Idx2->BrickDims3).field_0.field_0.Y);
  uVar16 = (ulong)(uint)(iVar30 * (Idx2->BrickDims3).field_0.field_0.Z);
  local_2d58 = uVar20;
  if (Mallocator()::Instance == '\0') goto LAB_0018b7f2;
LAB_0018a7c6:
  lVar10 = 0x28;
  do {
    *(undefined8 *)((long)&FileStack[0].FileOrder + lVar10) = 0;
    lVar10 = lVar10 + 0x30;
  } while (lVar10 != 0xc28);
  if ('\x0f' < Level) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                 );
  }
  uVar20 = (uint)uVar16;
  local_2d60 = (long)Level;
  pvVar22 = (Idx2->NFiles3).Arr + local_2d60;
  lVar10 = (long)(pvVar22->field_0).field_0.X;
  if (lVar10 == 0) {
    uVar16 = 1;
  }
  else {
    uVar15 = lVar10 - 1;
    lVar10 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    uVar16 = 1L << (-((byte)lVar10 ^ 0x3f) & 0x3f) & 0xffffffff;
    if (uVar15 == 0) {
      uVar16 = 1;
    }
  }
  lVar10 = (long)(pvVar22->field_0).field_0.Y;
  if (lVar10 != 0) {
    uVar15 = lVar10 - 1;
    lVar10 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    if (uVar15 != 0) {
      uVar18 = uVar18 << (-((byte)lVar10 ^ 0x3f) & 0x3f);
    }
  }
  lVar10 = (long)(pvVar22->field_0).field_0.Z;
  FileStack[0].FileTo3.field_0._8_4_ = 1;
  if (lVar10 != 0) {
    uVar15 = lVar10 - 1;
    lVar10 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    FileStack[0].FileTo3.field_0._8_4_ = 1;
    if (uVar15 != 0) {
      FileStack[0].FileTo3.field_0._8_4_ = (undefined4)(1L << (-((byte)lVar10 ^ 0x3f) & 0x3f));
    }
  }
  FileStack[0].FileOrder = (Idx2->FilesOrder).Arr[local_2d60];
  FileStack[0].PrevOrder = FileStack[0].FileOrder;
  FileStack[0].FileFrom3.field_0.field_3.XY.field_0 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
  FileStack[0].FileFrom3.field_0.field_0.Z = 0;
  FileStack[0].FileTo3.field_0.field_3.XY.field_0 = uVar18 | uVar16;
  FileStack[0].Address = 0;
  pvVar22 = (Idx2->ChunksPerFile3s).Arr + local_2d60;
  local_2ce8 = (ulong)(uVar20 & 0x1fffff) << 0x2a |
               (ulong)((uint)uVar14 & 0x1fffff) << 0x15 | (ulong)(uVar21 & 0x1fffff);
  uVar16 = 0;
  local_2d50 = uVar14;
  do {
    pfVar11 = FileStack + uVar16;
    uVar14 = pfVar11->FileOrder;
    uVar15 = uVar14 >> 2;
    pfVar11->FileOrder = uVar15;
    uVar27 = (uint)uVar14 & 3;
    local_2db8 = uVar16;
    if (uVar27 == 3) {
      if (uVar15 == 3) {
        pfVar11->FileOrder = FileStack[uVar16].PrevOrder;
      }
      else {
        FileStack[uVar16].PrevOrder = uVar15;
      }
    }
    else {
      local_2db8 = (ulong)((int)uVar16 - 1);
      iVar23 = FileStack[uVar16].FileFrom3.field_0.field_0.X;
      if (((FileStack[uVar16].FileTo3.field_0.field_0.X - iVar23 == 1) &&
          (iVar26 = FileStack[uVar16].FileFrom3.field_0.field_0.Y,
          FileStack[uVar16].FileTo3.field_0.field_0.Y - iVar26 == 1)) &&
         (iVar30 = FileStack[uVar16].FileFrom3.field_0.field_0.Z,
         FileStack[uVar16].FileTo3.field_0.field_0.Z - iVar30 == 1)) {
        lVar10 = 0x38;
        do {
          *(undefined8 *)((long)&uStack_1c48 + lVar10) = 0;
          *(undefined4 *)((long)auStack_1c40 + lVar10) = 0;
          *(undefined8 *)((long)&First.FileOrder + lVar10) = 0;
          lVar10 = lVar10 + 0x40;
        } while (lVar10 != 0x1038);
        iVar28 = (pvVar22->field_0).field_0.X;
        iVar25 = 1;
        iVar24 = 1;
        if ((long)iVar28 != 0) {
          uVar14 = (long)iVar28 - 1;
          lVar10 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          iVar24 = (int)(1L << (-((byte)lVar10 ^ 0x3f) & 0x3f));
          if (uVar14 == 0) {
            iVar24 = 1;
          }
        }
        iVar31 = (pvVar22->field_0).field_0.Y;
        if ((long)iVar31 != 0) {
          uVar14 = (long)iVar31 - 1;
          lVar10 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          iVar25 = (int)(1L << (-((byte)lVar10 ^ 0x3f) & 0x3f));
          if (uVar14 == 0) {
            iVar25 = 1;
          }
        }
        iVar2 = (pvVar22->field_0).field_0.Z;
        if ((long)iVar2 == 0) {
          iVar17 = 1;
        }
        else {
          uVar14 = (long)iVar2 - 1;
          lVar10 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          iVar17 = (int)(1L << (-((byte)lVar10 ^ 0x3f) & 0x3f));
          if (uVar14 == 0) {
            iVar17 = 1;
          }
        }
        First.FileOrder = (Idx2->ChunksOrderInFile).Arr[local_2d60];
        iVar28 = iVar28 * iVar23;
        iVar31 = iVar31 * iVar26;
        First.FileFrom3.field_0.field_0.Z = iVar2 * iVar30;
        First.FileFrom3.field_0.field_0.Y = iVar31;
        First.FileFrom3.field_0.field_0.X = iVar28;
        First.PrevOrder = First.FileOrder;
        First.FileTo3.field_0.field_0.X = iVar24 + iVar28;
        First.FileTo3.field_0.field_0.Y = iVar25 + iVar31;
        First.FileTo3.field_0.field_0.Z = iVar17 + First.FileFrom3.field_0.field_0.Z;
        First.Address = 0;
        local_1c08.field_0.X = 0;
        local_1c00[0] = 0;
        uVar14 = 0;
LAB_0018ad0f:
        puVar33 = (ulong *)(local_1c08.E + uVar14 * 0x10 + -0xc);
        uVar16 = *puVar33;
        uVar15 = uVar16 >> 2;
        *puVar33 = uVar15;
        uVar27 = (uint)uVar16 & 3;
        local_2dd8 = uVar14;
        if (uVar27 == 3) {
          if (uVar15 == 3) {
            *puVar33 = *(ulong *)(local_1c08.E + uVar14 * 0x10 + -10);
          }
          else {
            *(ulong *)(local_1c08.E + uVar14 * 0x10 + -10) = uVar15;
          }
        }
        else {
          local_2dd8 = (ulong)((int)uVar14 - 1);
          iVar23 = local_1c08.E[uVar14 * 0x10 + -8];
          if (((local_1c08.E[uVar14 * 0x10 + -5] - iVar23 == 1) &&
              (iVar26 = local_1c08.E[uVar14 * 0x10 + -7],
              local_1c08.E[uVar14 * 0x10 + -4] - iVar26 == 1)) &&
             (iVar30 = local_1c08.E[uVar14 * 0x10 + -6],
             local_1c08.E[uVar14 * 0x10 + -3] - iVar30 == 1)) {
            lVar10 = 0x38;
            do {
              *(undefined8 *)((long)&local_2c48.From + lVar10) = 0;
              *(undefined4 *)((long)&local_2c48.Dims + lVar10) = 0;
              *(undefined8 *)((long)&First_1.ChunkOrder + lVar10) = 0;
              lVar10 = lVar10 + 0x40;
            } while (lVar10 != 0x1038);
            iVar28 = *(int *)((long)(pvVar22 + -0x11) + 8);
            iVar25 = 1;
            iVar24 = 1;
            if ((long)iVar28 != 0) {
              uVar14 = (long)iVar28 - 1;
              lVar10 = 0x3f;
              if (uVar14 != 0) {
                for (; uVar14 >> lVar10 == 0; lVar10 = lVar10 + -1) {
                }
              }
              iVar24 = (int)(1L << (-((byte)lVar10 ^ 0x3f) & 0x3f));
              if (uVar14 == 0) {
                iVar24 = 1;
              }
            }
            iVar31 = *(int *)(pvVar22 + -0x10);
            if ((long)iVar31 != 0) {
              uVar14 = (long)iVar31 - 1;
              lVar10 = 0x3f;
              if (uVar14 != 0) {
                for (; uVar14 >> lVar10 == 0; lVar10 = lVar10 + -1) {
                }
              }
              iVar25 = (int)(1L << (-((byte)lVar10 ^ 0x3f) & 0x3f));
              if (uVar14 == 0) {
                iVar25 = 1;
              }
            }
            iVar2 = *(int *)((long)(pvVar22 + -0x10) + 4);
            if ((long)iVar2 == 0) {
              iVar17 = 1;
            }
            else {
              uVar14 = (long)iVar2 - 1;
              lVar10 = 0x3f;
              if (uVar14 != 0) {
                for (; uVar14 >> lVar10 == 0; lVar10 = lVar10 + -1) {
                }
              }
              iVar17 = (int)(1L << (-((byte)lVar10 ^ 0x3f) & 0x3f));
              if (uVar14 == 0) {
                iVar17 = 1;
              }
            }
            First_1.ChunkOrder = (Idx2->BricksOrderInChunk).Arr[local_2d60];
            iVar28 = iVar28 * iVar23;
            iVar31 = iVar31 * iVar26;
            First_1.ChunkFrom3.field_0.field_0.Z = iVar2 * iVar30;
            First_1.ChunkFrom3.field_0.field_0.Y = iVar31;
            First_1.ChunkFrom3.field_0.field_0.X = iVar28;
            First_1.ChunkTo3.field_0.field_0.X = iVar24 + iVar28;
            uVar16 = (ulong)(uint)First_1.ChunkTo3.field_0.field_0.X;
            First_1.PrevOrder = First_1.ChunkOrder;
            First_1.ChunkTo3.field_0.field_0.Y = iVar25 + iVar31;
            First_1.ChunkTo3.field_0.field_0.Z = iVar17 + First_1.ChunkFrom3.field_0.field_0.Z;
            uVar15 = 0;
            First_1.NChunksBefore = 0;
            First_1._48_8_ = First_1._48_8_ & 0xffffffff00000000;
            First_1.Address = 0;
LAB_0018b1d2:
            pcVar19 = &First_1 + uVar15;
            uVar14 = pcVar19->ChunkOrder;
            uVar12 = uVar14 >> 2;
            pcVar19->ChunkOrder = uVar12;
            uVar27 = (uint)uVar14 & 3;
            if (uVar27 == 3) {
              if (uVar12 == 3) {
                pcVar19->ChunkOrder = (&First_1)[uVar15].PrevOrder;
              }
              else {
                (&First_1)[uVar15].PrevOrder = uVar12;
              }
            }
            else {
              uVar12 = (ulong)((int)uVar15 - 1);
              iVar23 = (&First_1)[uVar15].ChunkFrom3.field_0.field_0.X;
              if ((((&First_1)[uVar15].ChunkTo3.field_0.field_0.X - iVar23 == 1) &&
                  (iVar26 = (&First_1)[uVar15].ChunkFrom3.field_0.field_0.Y,
                  (&First_1)[uVar15].ChunkTo3.field_0.field_0.Y - iVar26 == 1)) &&
                 (iVar30 = (&First_1)[uVar15].ChunkFrom3.field_0.field_0.Z,
                 (&First_1)[uVar15].ChunkTo3.field_0.field_0.Z - iVar30 == 1)) {
                Skip.From = (ulong)(iVar30 * uVar20 & 0x1fffff) << 0x2a |
                            (ulong)(iVar26 * (int)local_2d50 & 0x1fffff) << 0x15 |
                            (ulong)(iVar23 * uVar21 & 0x1fffff);
                Skip.Dims = local_2ce8;
                uVar14 = uVar12;
                eVar35 = Crop<idx2::extent,idx2::extent>(&Skip,local_2ce0);
                First_2.BrickOrder = (u64)&D_local->Mutex;
                First_2.PrevOrder = First_2.PrevOrder & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&First_2);
                First_2.PrevOrder = CONCAT71(First_2.PrevOrder._1_7_,1);
                D_local->NTasks = D_local->NTasks + 1;
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&First_2);
                if (Mallocator()::Instance == '\0') {
                  TraverseFirstLevel();
                }
                local_2c5c = 0;
                uStack_2c58 = 0;
                uStack_2c54 = 0;
                uStack_2c50 = 0;
                local_2c4c = 0;
                iVar3 = (&First_1)[uVar15].ChunkInFile;
                iStack_2c68 = (&First_1)[uVar15].ChunkFrom3.field_0.field_0.Z;
                uVar4 = *(undefined8 *)&(&First_1)[uVar15].ChunkFrom3.field_0;
                uStack_2c70 = (undefined4)uVar4;
                uStack_2c6c = (undefined4)((ulong)uVar4 >> 0x20);
                Brick3.field_0.field_0.Y = 0;
                Brick3.field_0.field_0.X = (&First_1)[uVar15].ChunkFrom3.field_0.field_0.Z;
                Brick3.field_0._8_4_ = (undefined4)uVar14;
                uVar18 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)(ulong)local_2d58,
                                        (int)*(undefined8 *)&(&First_1)[uVar15].ChunkFrom3.field_0,
                                        Brick3);
                pdVar8 = D_local;
                First_2.PrevOrder = 0;
                First_2.BrickOrder = (u64)operator_new(0xa8);
                *(undefined8 *)First_2.BrickOrder = 0;
                *(undefined8 *)(First_2.BrickOrder + 8) = 0;
                *(undefined8 **)(First_2.BrickOrder + 0x10) = &Mallocator()::Instance;
                *(undefined8 *)(First_2.BrickOrder + 0x18) = 0;
                *(undefined1 *)(First_2.BrickOrder + 0x20) = 10;
                *(ulong *)(First_2.BrickOrder + 0x21) = CONCAT17((undefined1)local_2c5c,uStack_2c63)
                ;
                *(ulong *)(First_2.BrickOrder + 0x29) =
                     CONCAT17((undefined1)uStack_2c54,CONCAT43(uStack_2c58,local_2c5c._1_3_));
                *(ulong *)(First_2.BrickOrder + 0x2c) = CONCAT44(uStack_2c54,uStack_2c58);
                *(ulong *)(First_2.BrickOrder + 0x34) = CONCAT44(local_2c4c,uStack_2c50);
                *(ulong *)(First_2.BrickOrder + 0x3c) = CONCAT44(uStack_2c70,local_2c74);
                *(ulong *)(First_2.BrickOrder + 0x44) = CONCAT44(iStack_2c68,uStack_2c6c);
                *(u64 *)(First_2.BrickOrder + 0x50) = uVar18;
                *(i32 *)(First_2.BrickOrder + 0x58) = iVar3;
                *(char *)(First_2.BrickOrder + 0x5c) = Level;
                *(extent *)(First_2.BrickOrder + 0x60) = eVar35;
                *(idx2_file **)(First_2.BrickOrder + 0x70) = Idx2;
                *(params **)(First_2.BrickOrder + 0x78) = local_2cd8;
                *(decode_data ***)(First_2.BrickOrder + 0x80) = &D_local;
                *(grid **)(First_2.BrickOrder + 0x88) = local_2cd0;
                *(mmap_volume ***)(First_2.BrickOrder + 0x90) = &OutVolFile_local;
                *(volume ***)(First_2.BrickOrder + 0x98) = &OutVolMem_local;
                First_2._24_8_ =
                     std::
                     _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:439:3)_()>_>
                     ::_M_invoke;
                First_2.BrickFrom3.field_0.field_3.XY.field_0 =
                     (v2<int>)std::
                              _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:439:3)_()>_>
                              ::_M_manager;
                __mutex = &(pdVar8->ThreadPool).tasks_mutex;
                iVar23 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                if (iVar23 != 0) break;
                std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
                push_back(&(pdVar8->ThreadPool).tasks.c,(value_type *)&First_2);
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                LOCK();
                paVar1 = &(pdVar8->ThreadPool).tasks_total;
                (paVar1->super___atomic_base<unsigned_long>)._M_i =
                     (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
                UNLOCK();
                std::condition_variable::notify_one();
                uVar15 = uVar12;
                if ((anon_union_8_4_6ba14846_for_v2<int>_1)
                    First_2.BrickFrom3.field_0.field_3.XY.field_0 !=
                    (anon_union_8_4_6ba14846_for_v2<int>_1)0x0) {
                  (*(code *)First_2.BrickFrom3.field_0.field_3.XY.field_0)(&First_2,&First_2,3);
                }
              }
              else {
                First_2.BrickOrder = pcVar19->ChunkOrder;
                First_2.PrevOrder = (&First_1)[uVar15].PrevOrder;
                uVar14 = *(ulong *)&(&First_1)[uVar15].ChunkFrom3.field_0;
                First_2._24_8_ = *(undefined8 *)((long)&(&First_1)[uVar15].ChunkFrom3.field_0 + 8);
                First_2.BrickTo3.field_0.field_4.YZ.field_0 =
                     (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                               ((long)&(&First_1)[uVar15].ChunkTo3.field_0.field_3.XY.field_0 + 4);
                First_2.NBricksBefore = (&First_1)[uVar15].NChunksBefore;
                First_2.BrickInChunk = (&First_1)[uVar15].ChunkInFile;
                First_2._52_4_ = *(undefined4 *)&(&First_1)[uVar15].field_0x34;
                First_2.Address = (&First_1)[uVar15].Address;
                Skip.From = pcVar19->ChunkOrder;
                Skip.Dims = (&First_1)[uVar15].PrevOrder;
                uStack_2d38 = *(undefined8 *)&(&First_1)[uVar15].ChunkFrom3.field_0;
                uStack_2d30 = *(undefined8 *)
                               ((long)&(&First_1)[uVar15].ChunkFrom3.field_0.field_4.YZ.field_0 + 4)
                ;
                uStack_2d28 = *(undefined8 *)
                               ((long)&(&First_1)[uVar15].ChunkTo3.field_0.field_3.XY.field_0 + 4);
                iStack_2d20 = (&First_1)[uVar15].NChunksBefore;
                uStack_2d18 = *(undefined8 *)&(&First_1)[uVar15].ChunkInFile;
                uVar16 = (ulong)(uVar27 << 2);
                iVar23 = *(int *)((long)&(&First_1)[uVar15].ChunkFrom3.field_0 + uVar16);
                iVar23 = (*(int *)((long)&(&First_1)[uVar15].ChunkTo3.field_0 + uVar16) - iVar23) /
                         2 + iVar23;
                *(int *)((long)&First_2.BrickTo3.field_0 + uVar16) = iVar23;
                iVar7 = First_2.NBricksBefore;
                *(int *)((long)&uStack_2d38 + uVar16) = iVar23;
                First_2.BrickFrom3.field_0.field_0.X = (int)uVar14;
                uVar6 = First_2.BrickFrom3.field_0.field_0.X;
                First_2.BrickFrom3.field_0.field_0.Y = (int)(uVar14 >> 0x20);
                local_2d54 = First_2.BrickTo3.field_0.field_0.X;
                uVar27 = First_2.BrickTo3.field_0.field_0.X - First_2.BrickFrom3.field_0._0_4_;
                lVar34 = (long)First_2.BrickTo3.field_0.field_0.Y;
                lVar10 = (long)First_2.BrickFrom3.field_0.field_0.Y;
                lVar32 = (long)First_2.BrickTo3.field_0.field_0.Z;
                lVar13 = (long)First_2.BrickFrom3.field_0.field_0.Z;
                Skip_1.From = (ulong)(First_2.BrickFrom3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                              ((ulong)(uint)First_2.BrickFrom3.field_0.field_0.Y & 0x1fffff) << 0x15
                              | uVar14 & 0x1fffff;
                Skip_1.Dims = (ulong)((uint)(lVar32 - lVar13) & 0x1fffff) << 0x2a |
                              (ulong)((uint)(lVar34 - lVar10) & 0x1fffff) << 0x15 |
                              (ulong)(uVar27 & 0x1fffff);
                First_2.BrickFrom3.field_0._0_8_ = uVar14;
                eVar35 = Crop<idx2::extent,idx2::extent>(&Skip_1,&local_2cf8);
                uVar18 = eVar35.Dims;
                iStack_2d20 = ((long)(uVar18 << 0x16) >> 0x2b) * ((long)(uVar18 << 0x2b) >> 0x2b) *
                              ((long)(uVar18 * 2) >> 0x2b) + iVar7;
                iVar3 = First_2.BrickInChunk;
                eVar35 = Crop<idx2::extent,idx2::extent>(&Skip_1,&local_2c88);
                uStack_2d18 = CONCAT44(uStack_2d18._4_4_,
                                       (((int)eVar35.Dims << 0xb) >> 0xb) *
                                       (int)((long)(eVar35.Dims * 2) >> 0x2b) *
                                       (int)((long)(eVar35.Dims << 0x16) >> 0x2b) + iVar3);
                First_2.Address = (&First_1)[uVar15].Address;
                local_2d10 = (long)(int)uVar27 * (lVar34 - lVar10) * (lVar32 - lVar13) +
                             First_2.Address;
                uVar14 = (long)(local_2cf8.From << 0x16) >> 0xb;
                uVar16 = uVar14 & 0xffffffff00000000;
                uVar29 = ((long)(local_2cf8.Dims << 0x16) >> 0xb) + uVar16;
                iVar30 = (int)((long)(local_2cf8.From << 0x2b) >> 0x2b);
                iVar28 = (((int)local_2cf8.Dims << 0xb) >> 0xb) + iVar30;
                iVar23 = (int)((long)(local_2cf8.From * 2) >> 0x2b);
                iVar25 = (int)((long)(local_2cf8.Dims * 2) >> 0x2b) + iVar23;
                iVar24 = (int)(uVar29 >> 0x20);
                iVar26 = (int)((long)(local_2cf8.From << 0x16) >> 0x2b);
                if ((int)uStack_2d38 < iVar28) {
                  uVar16 = uVar29 >> 0x20;
                  if (((uStack_2d38._4_4_ < iVar24) && ((int)uStack_2d30 < iVar25)) &&
                     (iVar30 < uStack_2d30._4_4_)) {
                    uVar16 = uVar14 >> 0x20;
                    if ((iVar26 < (int)uStack_2d28) && (iVar23 < uStack_2d28._4_4_)) {
                      *(undefined8 *)((long)&(&First_1)[uVar15].ChunkTo3.field_0 + 4) = uStack_2d28;
                      (&First_1)[uVar15].NChunksBefore = iStack_2d20;
                      *(undefined8 *)&(&First_1)[uVar15].ChunkInFile = uStack_2d18;
                      (&First_1)[uVar15].Address = local_2d10;
                      pcVar19->ChunkOrder = Skip.From;
                      (&First_1)[uVar15].PrevOrder = Skip.Dims;
                      *(undefined8 *)&(&First_1)[uVar15].ChunkFrom3.field_0 = uStack_2d38;
                      *(undefined8 *)((long)&(&First_1)[uVar15].ChunkFrom3.field_0 + 8) =
                           uStack_2d30;
                      uVar12 = uVar15;
                    }
                  }
                }
                uVar15 = uVar12;
                if ((((int)uVar6 < iVar28) && (First_2.BrickFrom3.field_0.field_0.Y < iVar24)) &&
                   ((First_2.BrickFrom3.field_0.field_0.Z < iVar25 &&
                    (((iVar30 < local_2d54 && (iVar26 < First_2.BrickTo3.field_0.field_0.Y)) &&
                     (iVar23 < First_2.BrickTo3.field_0.field_0.Z)))))) {
                  uVar15 = (ulong)((int)uVar12 + 1);
                  ((v2<int> *)((long)&(&First_1)[uVar15].ChunkTo3.field_0.field_3.XY.field_0 + 4))->
                  field_0 = (anon_union_8_4_6ba14846_for_v2<int>_1)
                            First_2.BrickTo3.field_0.field_4.YZ.field_0;
                  (&First_1)[uVar15].NChunksBefore = First_2.NBricksBefore;
                  (&First_1)[uVar15].ChunkInFile = First_2.BrickInChunk;
                  *(undefined4 *)&(&First_1)[uVar15].field_0x34 = First_2._52_4_;
                  (&First_1)[uVar15].Address = First_2.Address;
                  (&First_1)[uVar15].ChunkOrder = First_2.BrickOrder;
                  (&First_1)[uVar15].PrevOrder = First_2.PrevOrder;
                  (&First_1)[uVar15].ChunkFrom3.field_0.field_3.XY.field_0 =
                       (anon_union_8_4_6ba14846_for_v2<int>_1)
                       First_2.BrickFrom3.field_0.field_3.XY.field_0;
                  *(undefined8 *)
                   ((long)&(&First_1)[uVar15].ChunkFrom3.field_0.field_4.YZ.field_0 + 4) =
                       First_2._24_8_;
                }
              }
            }
            if ((int)uVar15 < 0) goto LAB_0018b780;
            goto LAB_0018b1d2;
          }
          First_1.ChunkTo3.field_0.field_0.Y =
               (int)*(undefined8 *)(local_1c08.E + uVar14 * 0x10 + -4);
          First_1.ChunkTo3.field_0.field_0.Z =
               (int)((ulong)*(undefined8 *)(local_1c08.E + uVar14 * 0x10 + -4) >> 0x20);
          First_1.NChunksBefore = *(i64 *)(local_1c08.E + uVar14 * 0x10 + -2);
          First_1.ChunkInFile = (local_1c08.E + uVar14 * 0x10)[0];
          First_1._52_4_ = (local_1c08.E + uVar14 * 0x10)[1];
          First_1.Address = local_1c00[uVar14 * 8];
          First_1.ChunkOrder = *puVar33;
          First_1.PrevOrder = *(u64 *)(local_1c08.E + uVar14 * 0x10 + -10);
          First_1.ChunkFrom3.field_0.field_3.XY.field_0 =
               (v2<int>)(v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                                  (local_1c08.E + uVar14 * 0x10 + -8);
          First_1.ChunkFrom3.field_0.field_0.Z =
               (int)*(undefined8 *)(local_1c08.E + uVar14 * 0x10 + -6);
          First_1.ChunkTo3.field_0.field_0.X =
               (int)((ulong)*(undefined8 *)(local_1c08.E + uVar14 * 0x10 + -6) >> 0x20);
          First_2.BrickOrder = *puVar33;
          First_2.PrevOrder = *(u64 *)(local_1c08.E + uVar14 * 0x10 + -10);
          First_2.BrickFrom3.field_0.field_3.XY.field_0 =
               (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                         (local_1c08.E + uVar14 * 0x10 + -8);
          First_2._24_8_ = *(undefined8 *)(local_1c08.E + uVar14 * 0x10 + -6);
          First_2.BrickTo3.field_0.field_4.YZ.field_0 =
               (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                         (local_1c08.E + uVar14 * 0x10 + -4);
          First_2.NBricksBefore = *(i64 *)(local_1c08.E + uVar14 * 0x10 + -2);
          First_2.BrickInChunk = (local_1c08.E + uVar14 * 0x10)[0];
          First_2._52_4_ = (local_1c08.E + uVar14 * 0x10)[1];
          uVar16 = (ulong)(uVar27 << 2);
          iVar23 = *(int *)((long)&First + uVar16 + uVar14 * 0x40 + 0x10);
          iVar23 = (*(int *)((long)&First + uVar16 + uVar14 * 0x40 + 0x1c) - iVar23) / 2 + iVar23;
          *(int *)((long)&First_1.ChunkTo3.field_0 + uVar16) = iVar23;
          *(int *)((long)&First_2.BrickFrom3.field_0 + uVar16) = iVar23;
          iVar7 = First_1.NChunksBefore;
          uVar9 = First_1.ChunkTo3.field_0.field_0.X;
          uVar6 = First_1.ChunkFrom3.field_0.field_0.X;
          uVar27 = First_1.ChunkTo3.field_0.field_0.X - First_1.ChunkFrom3.field_0._0_4_;
          lVar32 = (long)First_1.ChunkTo3.field_0.field_0.Y;
          lVar10 = (long)First_1.ChunkFrom3.field_0.field_0.Y;
          lVar34 = (long)First_1.ChunkTo3.field_0.field_0.Z;
          lVar13 = (long)First_1.ChunkFrom3.field_0.field_0.Z;
          Skip.From = (ulong)(First_1.ChunkFrom3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                      ((ulong)(uint)First_1.ChunkFrom3.field_0.field_0.Y & 0x1fffff) << 0x15 |
                      (ulong)First_1.ChunkFrom3.field_0.field_3.XY.field_0 & 0x1fffff;
          Skip.Dims = (ulong)((uint)(lVar34 - lVar13) & 0x1fffff) << 0x2a |
                      (ulong)((uint)(lVar32 - lVar10) & 0x1fffff) << 0x15 |
                      (ulong)(uVar27 & 0x1fffff);
          eVar35 = Crop<idx2::extent,idx2::extent>(&Skip,&local_2d08);
          uVar18 = eVar35.Dims;
          First_2.NBricksBefore =
               ((long)(uVar18 << 0x16) >> 0x2b) * ((long)(uVar18 << 0x2b) >> 0x2b) *
               ((long)(uVar18 * 2) >> 0x2b) + iVar7;
          iVar3 = First_1.ChunkInFile;
          eVar35 = Crop<idx2::extent,idx2::extent>(&Skip,&local_2c98);
          iVar30 = (((int)eVar35.Dims << 0xb) >> 0xb) * (int)((long)(eVar35.Dims * 2) >> 0x2b) *
                   (int)((long)(eVar35.Dims << 0x16) >> 0x2b) + iVar3;
          First_2.BrickInChunk = iVar30;
          First_1.Address = local_1c00[uVar14 * 8];
          First_2.Address =
               (long)(int)uVar27 * (lVar32 - lVar10) * (lVar34 - lVar13) + First_1.Address;
          iVar28 = (int)((long)(local_2d08.From << 0x2b) >> 0x2b);
          iVar25 = (((int)local_2d08.Dims << 0xb) >> 0xb) + iVar28;
          iVar23 = (int)((long)(local_2d08.From * 2) >> 0x2b);
          iVar24 = (int)((long)(local_2d08.Dims * 2) >> 0x2b) + iVar23;
          iVar31 = (int)(((long)(local_2d08.Dims << 0x16) >> 0xb) +
                         ((long)(local_2d08.From << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
          iVar26 = (int)((long)(local_2d08.From << 0x16) >> 0x2b);
          if (((First_2.BrickFrom3.field_0.field_0.X < iVar25) &&
              (First_2.BrickFrom3.field_0.field_0.Y < iVar31)) &&
             (((First_2.BrickFrom3.field_0.field_0.Z < iVar24 &&
               ((iVar28 < First_2.BrickTo3.field_0.field_0.X &&
                (iVar26 < First_2.BrickTo3.field_0.field_0.Y)))) &&
              (iVar23 < First_2.BrickTo3.field_0.field_0.Z)))) {
            ((v2<int> *)(local_1c08.E + uVar14 * 0x10 + -4))->field_0 =
                 (anon_union_8_4_6ba14846_for_v2<int>_1)First_2.BrickTo3.field_0.field_4.YZ.field_0;
            *(i64 *)(local_1c08.E + uVar14 * 0x10 + -2) = First_2.NBricksBefore;
            (local_1c08.E + uVar14 * 0x10)[0] = iVar30;
            (local_1c08.E + uVar14 * 0x10)[1] = First_2._52_4_;
            local_1c00[uVar14 * 8] = First_2.Address;
            *puVar33 = First_2.BrickOrder;
            *(u64 *)(local_1c08.E + uVar14 * 0x10 + -10) = First_2.PrevOrder;
            ((v2<int> *)(local_1c08.E + uVar14 * 0x10 + -8))->field_0 =
                 (anon_union_8_4_6ba14846_for_v2<int>_1)
                 First_2.BrickFrom3.field_0.field_3.XY.field_0;
            *(undefined8 *)(local_1c08.E + uVar14 * 0x10 + -6) = First_2._24_8_;
            local_2dd8 = uVar14;
          }
          if ((((((int)uVar6 < iVar25) && (First_1.ChunkFrom3.field_0.field_0.Y < iVar31)) &&
               (First_1.ChunkFrom3.field_0.field_0.Z < iVar24)) &&
              ((iVar28 < (int)uVar9 && (iVar26 < First_1.ChunkTo3.field_0.field_0.Y)))) &&
             (iVar23 < First_1.ChunkTo3.field_0.field_0.Z)) {
            local_2dd8 = (ulong)((int)local_2dd8 + 1);
            *(ulong *)(local_1c08.E + local_2dd8 * 0x10 + -4) =
                 CONCAT44(First_1.ChunkTo3.field_0.field_0.Z,First_1.ChunkTo3.field_0.field_0.Y);
            *(i64 *)(local_1c08.E + local_2dd8 * 0x10 + -2) = First_1.NChunksBefore;
            (local_1c08.E + local_2dd8 * 0x10)[0] = First_1.ChunkInFile;
            (local_1c08.E + local_2dd8 * 0x10)[1] = First_1._52_4_;
            local_1c00[local_2dd8 * 8] = First_1.Address;
            *(u64 *)(local_1c08.E + local_2dd8 * 0x10 + -0xc) = First_1.ChunkOrder;
            *(u64 *)(local_1c08.E + local_2dd8 * 0x10 + -10) = First_1.PrevOrder;
            ((v2<int> *)(local_1c08.E + local_2dd8 * 0x10 + -8))->field_0 =
                 (anon_union_8_4_6ba14846_for_v2<int>_1)
                 First_1.ChunkFrom3.field_0.field_3.XY.field_0;
            *(ulong *)(local_1c08.E + local_2dd8 * 0x10 + -6) =
                 CONCAT44(First_1.ChunkTo3.field_0.field_0.X,First_1.ChunkFrom3.field_0.field_0.Z);
          }
        }
LAB_0018b780:
        uVar14 = local_2dd8;
        if ((int)local_2dd8 < 0) goto LAB_0018b795;
        goto LAB_0018ad0f;
      }
      First.FileFrom3.field_0.field_3.XY.field_0 =
           (v2<int>)*(undefined8 *)&FileStack[uVar16].FileFrom3.field_0;
      uVar5 = *(undefined8 *)((long)&FileStack[uVar16].FileFrom3.field_0 + 8);
      uVar4 = *(undefined8 *)((long)&FileStack[uVar16].FileTo3.field_0 + 4);
      First.FileTo3.field_0.field_0.Y = (int)uVar4;
      First.FileTo3.field_0.field_0.Z = (int)((ulong)uVar4 >> 0x20);
      First.Address = FileStack[uVar16].Address;
      First.FileOrder = pfVar11->FileOrder;
      First.PrevOrder = FileStack[uVar16].PrevOrder;
      First.FileFrom3.field_0.field_0.Z = (int)uVar5;
      First.FileTo3.field_0.field_0.X = (int)((ulong)uVar5 >> 0x20);
      uVar4 = *(undefined8 *)((long)&FileStack[uVar16].FileTo3.field_0 + 4);
      First_1.ChunkTo3.field_0.field_0.Y = (int)uVar4;
      First_1.ChunkTo3.field_0.field_0.Z = (int)((ulong)uVar4 >> 0x20);
      First_1.ChunkOrder = pfVar11->FileOrder;
      First_1.PrevOrder = FileStack[uVar16].PrevOrder;
      uVar4 = *(undefined8 *)((long)&FileStack[uVar16].FileFrom3.field_0 + 8);
      First_1.ChunkFrom3.field_0.field_3.XY.field_0 =
           (v2<int>)(v2<int>)FileStack[uVar16].FileFrom3.field_0.field_3.XY.field_0;
      First_1.ChunkFrom3.field_0.field_0.Z = (int)uVar4;
      First_1.ChunkTo3.field_0.field_0.X = (int)((ulong)uVar4 >> 0x20);
      uVar14 = (ulong)(uVar27 << 2);
      iVar23 = *(int *)((long)&FileStack[uVar16].FileFrom3.field_0 + uVar14);
      iVar23 = (*(int *)((long)&FileStack[uVar16].FileTo3.field_0 + uVar14) - iVar23) / 2 + iVar23;
      *(int *)((long)&First.FileTo3.field_0 + uVar14) = iVar23;
      *(int *)((long)&First_1.ChunkFrom3.field_0 + uVar14) = iVar23;
      First.Address = FileStack[uVar16].Address;
      First_1.NChunksBefore =
           (long)(First.FileTo3.field_0.field_0.Z - First.FileFrom3.field_0._8_4_) *
           (long)(First.FileTo3.field_0.field_0.Y - First.FileFrom3.field_0._4_4_) *
           (long)(First.FileTo3.field_0.field_0.X - First.FileFrom3.field_0._0_4_) + First.Address;
      iVar25 = (int)((long)(local_2ca8.From << 0x2b) >> 0x2b);
      iVar24 = (((int)local_2ca8.Dims << 0xb) >> 0xb) + iVar25;
      iVar26 = (int)((long)(local_2ca8.From * 2) >> 0x2b);
      iVar30 = (int)((long)(local_2ca8.Dims * 2) >> 0x2b) + iVar26;
      iVar28 = (int)(((long)(local_2ca8.Dims << 0x16) >> 0xb) +
                     ((long)(local_2ca8.From << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
      iVar23 = (int)((long)(local_2ca8.From << 0x16) >> 0x2b);
      if (((First_1.ChunkFrom3.field_0.field_0.X < iVar24) &&
          (First_1.ChunkFrom3.field_0.field_0.Y < iVar28)) &&
         ((First_1.ChunkFrom3.field_0.field_0.Z < iVar30 &&
          (((iVar25 < First_1.ChunkTo3.field_0.field_0.X &&
            (iVar23 < First_1.ChunkTo3.field_0.field_0.Y)) &&
           (iVar26 < First_1.ChunkTo3.field_0.field_0.Z)))))) {
        FileStack[uVar16].FileFrom3.field_0.field_3.XY.field_0 =
             (anon_union_8_4_6ba14846_for_v2<int>_1)First_1.ChunkFrom3.field_0.field_3.XY.field_0;
        *(ulong *)((long)&FileStack[uVar16].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
             CONCAT44(First_1.ChunkTo3.field_0.field_0.X,First_1.ChunkFrom3.field_0.field_0.Z);
        *(ulong *)((long)&FileStack[uVar16].FileTo3.field_0.field_3.XY.field_0 + 4) =
             CONCAT44(First_1.ChunkTo3.field_0.field_0.Z,First_1.ChunkTo3.field_0.field_0.Y);
        FileStack[uVar16].Address = First_1.NChunksBefore;
        pfVar11->FileOrder = First_1.ChunkOrder;
        FileStack[uVar16].PrevOrder = First_1.PrevOrder;
        FileStack[uVar16].FileFrom3.field_0.field_3.XY.field_0 =
             (anon_union_8_4_6ba14846_for_v2<int>_1)First_1.ChunkFrom3.field_0.field_3.XY.field_0;
        *(ulong *)((long)&FileStack[uVar16].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
             CONCAT44(First_1.ChunkTo3.field_0.field_0.X,First_1.ChunkFrom3.field_0.field_0.Z);
        local_2db8 = uVar16;
      }
      if (((First.FileFrom3.field_0.field_0.X < iVar24) &&
          (First.FileFrom3.field_0.field_0.Y < iVar28)) &&
         ((First.FileFrom3.field_0.field_0.Z < iVar30 &&
          ((iVar25 < First.FileTo3.field_0.field_0.X &&
           (iVar26 < First.FileTo3.field_0.field_0.Z && iVar23 < First.FileTo3.field_0.field_0.Y))))
         )) {
        local_2db8 = (ulong)((int)local_2db8 + 1);
        *(undefined8 *)&FileStack[local_2db8].FileFrom3.field_0 =
             First.FileFrom3.field_0.field_3.XY.field_0;
        *(ulong *)((long)&FileStack[local_2db8].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
             CONCAT44(First.FileTo3.field_0.field_0.X,First.FileFrom3.field_0.field_0.Z);
        *(ulong *)((long)&FileStack[local_2db8].FileTo3.field_0.field_3.XY.field_0 + 4) =
             CONCAT44(First.FileTo3.field_0.field_0.Z,First.FileTo3.field_0.field_0.Y);
        FileStack[local_2db8].Address = First.Address;
        FileStack[local_2db8].FileOrder = First.FileOrder;
        FileStack[local_2db8].PrevOrder = First.PrevOrder;
        *(undefined8 *)&FileStack[local_2db8].FileFrom3.field_0 =
             First.FileFrom3.field_0.field_3.XY.field_0;
        *(ulong *)((long)&FileStack[local_2db8].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
             CONCAT44(First.FileTo3.field_0.field_0.X,First.FileFrom3.field_0.field_0.Z);
      }
    }
LAB_0018b795:
    uVar16 = local_2db8;
    if ((int)local_2db8 < 0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x1de;
      return (error<idx2::idx2_err_code>)ZEXT816(0x1bd78d);
    }
  } while( true );
  std::__throw_system_error(iVar23);
LAB_0018b7f2:
  TraverseFirstLevel();
  uVar16 = uVar16 & 0xffffffff;
  goto LAB_0018a7c6;
}

Assistant:

error<idx2_err_code>
TraverseFirstLevel(const idx2_file& Idx2,
                   const params& P,
                   decode_data* D,
                   const grid& OutGrid,
                   mmap_volume* OutVolFile,
                   volume* OutVolMem)
{
  i8 Level = Idx2.NLevels - 1; // coarsest level
  extent ExtentInBricks, ExtentInChunks, ExtentInFiles;
  extent VolExtentInBricks, VolExtentInChunks, VolExtentInFiles;
  ComputeExtentsForTraversal(Idx2,
                             P.DecodeExtent,
                             Level,
                             &ExtentInBricks,
                             &ExtentInChunks,
                             &ExtentInFiles,
                             &VolExtentInBricks,
                             &VolExtentInChunks,
                             &VolExtentInFiles);
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level); // dimension of bricks on this level
  decode_state Ds;
  idx2_FileTraverse(
    idx2_ChunkTraverse(
      idx2_BrickTraverse(
        extent BrickExtent = extent(Top.BrickFrom3 * B3, B3);
        extent BrickExtentCrop = Crop(BrickExtent, P.DecodeExtent);
        {
          std::unique_lock<std::mutex> Lock(D->Mutex);
          ++D->NTasks;
        }
        decode_state First;
        First.BrickInChunk = Top.BrickInChunk;
        First.Level = Level;
        First.Brick3 = Top.BrickFrom3;
        First.Brick = GetLinearBrick(Idx2, Level, Top.BrickFrom3);
        D->ThreadPool.push_task([&, First, BrickExtentCrop]() {
          TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        });
        //auto Task = stlab::async(stlab::default_executor,
        //  [&, First, BrickExtentCrop]()
        //  {
        //    TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        //  });
        //Task.detach();
        ,
        64,
        Idx2.BricksOrderInChunk[Level],
        ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[Level],
        Idx2.BricksPerChunk3s[Level],
        ExtentInBricks,
        VolExtentInBricks);
      ,
      64,
      Idx2.ChunksOrderInFile[Level],
      FileTop.FileFrom3 * Idx2.ChunksPerFile3s[Level],
      Idx2.ChunksPerFile3s[Level],
      ExtentInChunks,
      VolExtentInChunks);
    , 64, Idx2.FilesOrder[Level], v3i(0), Idx2.NFiles3[Level], ExtentInFiles, VolExtentInFiles);

  return idx2_Error(idx2_err_code::NoError);
}